

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall mario::TcpServer::removeConnectionInLoop(TcpServer *this,TcpConnectionPtr *conn)

{
  Writer *pWVar1;
  element_type *peVar2;
  string *psVar3;
  EventLoop *this_00;
  code *local_f8;
  undefined8 local_f0;
  type local_e8;
  Functor local_c8;
  EventLoop *local_a8;
  EventLoop *ioLoop;
  Writer local_90;
  __shared_ptr_access<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  TcpConnectionPtr *conn_local;
  TcpServer *this_local;
  
  local_18 = (__shared_ptr_access<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             conn;
  conn_local = (TcpConnectionPtr *)this;
  EventLoop::assertInLoopThread(this->_loop);
  el::base::Writer::Writer
            (&local_90,Info,
             "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/TcpServer.cpp"
             ,0x52,"void mario::TcpServer::removeConnectionInLoop(const TcpConnectionPtr &)",
             NormalLog,0);
  pWVar1 = el::base::Writer::construct(&local_90,1,el::base::consts::kDefaultLoggerId);
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [36])"TcpServer::removeConnectionInLoop [")
  ;
  pWVar1 = el::base::Writer::operator<<(pWVar1,&this->_name);
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [16])"] - connection ");
  peVar2 = std::__shared_ptr_access<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_18);
  psVar3 = TcpConnection::name_abi_cxx11_(peVar2);
  el::base::Writer::operator<<(pWVar1,psVar3);
  el::base::Writer::~Writer(&local_90);
  peVar2 = std::__shared_ptr_access<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_18);
  psVar3 = TcpConnection::name_abi_cxx11_(peVar2);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>_>_>
  ::erase(&this->_connections,psVar3);
  peVar2 = std::__shared_ptr_access<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_18);
  this_00 = TcpConnection::getLoop(peVar2);
  local_f8 = TcpConnection::connectDestroyed;
  local_f0 = 0;
  local_a8 = this_00;
  std::bind<void(mario::TcpConnection::*)(),std::shared_ptr<mario::TcpConnection>const&>
            (&local_e8,(offset_in_TcpConnection_to_subr *)&local_f8,
             (shared_ptr<mario::TcpConnection> *)local_18);
  std::function<void()>::
  function<std::_Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>,void>
            ((function<void()> *)&local_c8,&local_e8);
  EventLoop::queueInLoop(this_00,&local_c8);
  std::function<void_()>::~function(&local_c8);
  std::_Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>::~_Bind
            (&local_e8);
  return;
}

Assistant:

void TcpServer::removeConnectionInLoop(const TcpConnectionPtr& conn) {
    _loop->assertInLoopThread();
    LOG(INFO) << "TcpServer::removeConnectionInLoop [" << _name << "] - connection " << conn->name();
    _connections.erase(conn->name());
    EventLoop* ioLoop = conn->getLoop();
    ioLoop->queueInLoop(
            std::bind(&TcpConnection::connectDestroyed, conn)
            );
}